

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

int Gia_ManCrossCut(Gia_Man_t *p,int fReverse)

{
  Gia_Obj_t *pGVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  Vec_Int_t *__ptr;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  
  __ptr = Gia_ManDfsForCrossCut(p,fReverse);
  iVar3 = __ptr->nSize;
  if ((long)iVar3 < 1) {
    iVar8 = 0;
  }
  else {
    piVar5 = __ptr->pArray;
    lVar7 = 0;
    iVar8 = 0;
    iVar9 = 0;
    do {
      iVar4 = piVar5[lVar7];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar4;
      iVar9 = (iVar9 + 1) - (uint)(pGVar1->Value == 0);
      if (iVar8 <= iVar9) {
        iVar8 = iVar9;
      }
      uVar6 = *(ulong *)pGVar1;
      uVar10 = uVar6 & 0x1fffffff;
      if (uVar10 == 0x1fffffff || (int)uVar6 < 0) {
        if ((int)uVar6 < 0 && (int)uVar10 != 0x1fffffff) goto LAB_007885f6;
      }
      else {
        puVar2 = &pGVar1[-uVar10].Value;
        *puVar2 = *puVar2 - 1;
        iVar9 = iVar9 - (uint)(*puVar2 == 0);
        uVar10 = (ulong)((uint)(uVar6 >> 0x20) & 0x1fffffff);
LAB_007885f6:
        puVar2 = &pGVar1[-uVar10].Value;
        *puVar2 = *puVar2 - 1;
        iVar9 = iVar9 - (uint)(*puVar2 == 0);
      }
      lVar7 = lVar7 + 1;
    } while (iVar3 != lVar7);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if ((0 < p->nObjs) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    lVar7 = 0;
    do {
      if (*(int *)((long)&p->pObjs->Value + lVar7) != 0) {
        __assert_fail("pObj->Value == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                      ,0x34f,"int Gia_ManCrossCut(Gia_Man_t *, int)");
      }
      lVar7 = lVar7 + 0xc;
    } while ((ulong)(uint)p->nObjs * 0xc != lVar7);
  }
  return iVar8;
}

Assistant:

int Gia_ManCrossCut( Gia_Man_t * p, int fReverse )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i, nCutCur = 0, nCutMax = 0;
    vNodes = Gia_ManDfsForCrossCut( p, fReverse );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
    {
        if ( pObj->Value )
            nCutCur++;
        if ( nCutMax < nCutCur )
            nCutMax = nCutCur;
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
            if ( --Gia_ObjFanin1(pObj)->Value == 0 )
                nCutCur--;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
        }
    }
    Vec_IntFree( vNodes );
    Gia_ManForEachObj( p, pObj, i )
        assert( pObj->Value == 0 );
    return nCutMax;
}